

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

void av1_tf_do_filtering_row(AV1_COMP *cpi,ThreadData_conflict *td,int mb_row)

{
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  int64_t *piVar4;
  ushort uVar5;
  uint uVar6;
  yv12_buffer_config *pyVar7;
  uint8_t *puVar8;
  aom_variance_fn_t vf;
  YV12_BUFFER_CONFIG *pYVar9;
  bool bVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  ulong uVar22;
  short sVar23;
  undefined2 uVar24;
  FULLPEL_MV FVar25;
  int iVar26;
  ulong uVar27;
  _func_void_yv12_buffer_config_ptr_macroblockd_ptr_BLOCK_SIZE_int_int_int_double_ptr_MV_ptr_int_ptr_int_int_int_uint8_t_ptr_uint32_t_ptr_uint16_t_ptr
  **pp_Var28;
  byte bVar29;
  byte bVar30;
  int i_1;
  int *piVar31;
  ulong uVar32;
  uint8_t uVar33;
  int iVar34;
  uint uVar35;
  undefined4 in_register_00000014;
  int ref_stride;
  uint8_t *puVar36;
  int j;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  int size;
  long lVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  FULLPEL_MV *best_mv;
  ulong uVar44;
  MV MVar45;
  uint uVar46;
  long lVar47;
  uint16_t *puVar48;
  int iVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  int plane;
  uint32_t *puVar53;
  search_site_config *search_sites;
  double dVar54;
  undefined1 auVar55 [16];
  MV local_424;
  undefined8 local_420;
  FRAME_TYPE local_411;
  int local_410;
  MV ref_mv;
  uint8_t *local_408;
  MV local_3f4;
  MV baseline_mv;
  uint sse;
  undefined8 local_3c0;
  undefined8 local_3b8;
  YV12_BUFFER_CONFIG *local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  long local_398;
  ulong local_390;
  ulong local_388;
  uint16_t *local_380;
  uint32_t *local_378;
  ulong local_370;
  ulong local_368;
  macroblockd_plane *local_360;
  MACROBLOCKD *local_358;
  long local_350;
  long local_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  uint8_t *local_328;
  ulong local_320;
  search_site_config *local_318;
  int local_30c;
  int local_308;
  int local_304;
  uint local_300;
  int distortion;
  int subblock_mses [4];
  MV subblock_mvs [4];
  FULLPEL_MV_STATS local_28c;
  size_t local_280;
  size_t local_278;
  search_site_config *local_270;
  code *local_268;
  search_site_config *local_260;
  search_site_config *local_258;
  double *local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  scale_factors *local_220;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int cost_list [5];
  buf_2d ori_pre_buf;
  buf_2d ori_src_buf;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  
  local_3c0 = CONCAT44(in_register_00000014,mb_row);
  uVar50 = (cpi->tf_ctx).num_frames;
  uVar6 = (cpi->tf_ctx).filter_frame_idx;
  local_30c = (cpi->tf_ctx).compute_frame_diff;
  uVar33 = ((cpi->common).seq_params)->monochrome;
  lVar47 = (long)(cpi->tf_ctx).num_pels;
  local_411 = (cpi->ppi->gf_group).frame_type[cpi->gf_frame_index];
  iVar26 = (cpi->oxcf).border_in_pixels;
  local_230 = (ulong)(uint)(mb_row * 0x20);
  iVar41 = (mb_row * -0x20 + 8) - iVar26;
  iVar39 = mb_row * -0x20 + -0x28;
  if (iVar39 < iVar41) {
    iVar39 = iVar41;
  }
  pyVar7 = (cpi->tf_ctx).frames[(int)uVar6];
  local_240 = (ulong)(uint)(cpi->tf_ctx).q_factor;
  local_248 = (ulong)(uint)(cpi->sf).hl_sf.weight_calc_level_in_tf;
  local_378 = (td->tf_data).accum;
  local_380 = (td->tf_data).count;
  puVar8 = (td->tf_data).pred;
  local_3a0 = CONCAT44(local_3a0._4_4_,(cpi->oxcf).algo_cfg.arnr_strength);
  (td->mb).mv_limits.row_min = iVar39;
  local_308 = mb_row * 8;
  iVar41 = (cpi->common).mi_params.mi_rows + mb_row * -8;
  iVar39 = iVar26 + iVar41 * 4 + -0x28;
  iVar26 = iVar41 * 4 + 8;
  if (iVar39 < iVar26) {
    iVar26 = iVar39;
  }
  (td->mb).mv_limits.row_max = iVar26;
  local_370 = (ulong)((uint)(uVar33 == '\0') * 2 + 1);
  local_280 = lVar47 * 4;
  local_278 = lVar47 * 2;
  local_268 = init_motion_compensation_nstep;
  local_350 = 6;
  if ((int)uVar50 < 1) {
    uVar50 = 0;
  }
  local_238 = (ulong)uVar50;
  local_220 = &(cpi->tf_ctx).sf;
  local_250 = (cpi->tf_ctx).noise_levels;
  local_358 = &(td->mb).e_mbd;
  pbVar1 = &(td->mb).plane[0].src;
  pbVar2 = (td->mb).e_mbd.plane[0].pre;
  psVar3 = (td->mb).search_site_cfg_buf;
  local_270 = (td->mb).search_site_cfg_buf + 1;
  local_260 = (cpi->mv_search_params).search_site_cfg[1];
  local_258 = (cpi->mv_search_params).search_site_cfg[0];
  local_360 = (td->mb).e_mbd.plane;
  uVar27 = 0;
  while (iVar26 = (int)uVar27, iVar26 < (cpi->tf_ctx).mb_cols) {
    local_304 = iVar26 * 8;
    iVar39 = (cpi->oxcf).border_in_pixels;
    local_228 = (ulong)(uint)(iVar26 * 0x20);
    iVar34 = (iVar26 * -0x20 + 8) - iVar39;
    iVar41 = iVar26 * -0x20 + -0x28;
    if (iVar41 < iVar34) {
      iVar41 = iVar34;
    }
    (td->mb).mv_limits.col_min = iVar41;
    iVar34 = (cpi->common).mi_params.mi_cols + iVar26 * -8;
    iVar41 = iVar39 + iVar34 * 4 + -0x28;
    iVar39 = iVar34 * 4 + 8;
    if (iVar41 < iVar39) {
      iVar39 = iVar41;
    }
    (td->mb).mv_limits.col_max = iVar39;
    memset(local_378,0,local_280);
    memset(local_380,0,local_278);
    ref_mv.row = 0;
    ref_mv.col = 0;
    local_3a8 = uVar27;
    if ((cpi->sf).hl_sf.allow_sub_blk_me_in_tf == 0) {
      bVar10 = true;
    }
    else {
      local_420 = (double)(CONCAT44(local_420._4_4_,(uint)pyVar7->flags >> 3) & 0xffffffff00000001);
      iVar39 = (pyVar7->field_4).field_0.y_stride;
      vf = cpi->ppi->fn_ptr[0].vf;
      puVar36 = (pyVar7->field_5).buffers[0] + (iVar39 * (int)local_3c0 + iVar26) * 0x20;
      iVar26 = 0x7fffffff;
      iVar41 = 0;
      for (uVar27 = 0; uVar27 < 0x20; uVar27 = uVar27 + 4) {
        for (uVar38 = 0; uVar38 < 0x20; uVar38 = uVar38 + 4) {
          iVar34 = av1_calc_normalized_variance(vf,puVar36 + uVar38,iVar39,(int)local_420._0_4_);
          if (iVar34 <= iVar26) {
            iVar26 = iVar34;
          }
          if (iVar41 <= iVar34) {
            iVar41 = iVar34;
          }
        }
        puVar36 = puVar36 + (long)iVar39 * 4;
      }
      local_420 = log1p((double)iVar26 * 0.0625);
      dVar54 = log1p((double)iVar41 * 0.0625);
      bVar10 = 4.0 < dVar54 - local_420;
    }
    local_388 = 0;
    local_3f4.row = 0;
    local_3f4.col = 0;
    uVar27 = 0;
    while( true ) {
      iVar26 = (int)local_3a8;
      if (uVar27 == local_238) break;
      pYVar9 = (cpi->tf_ctx).frames[uVar27];
      if (pYVar9 == (YV12_BUFFER_CONFIG *)0x0) {
        iVar26 = (int)local_3a0;
      }
      else {
        subblock_mvs[0].row = 0;
        subblock_mvs[0].col = 0;
        subblock_mvs[1].row = 0;
        subblock_mvs[1].col = 0;
        subblock_mvs[2].row = 0;
        subblock_mvs[2].col = 0;
        subblock_mvs[3].row = 0;
        subblock_mvs[3].col = 0;
        subblock_mses[0] = 0x7fffffff;
        subblock_mses[1] = 0x7fffffff;
        subblock_mses[2] = 0x7fffffff;
        subblock_mses[3] = 0x7fffffff;
        if (uVar27 == uVar6) {
          local_3f4 = (MV)-(int)local_3f4;
          iVar26 = (int)local_388;
          local_388 = (ulong)(uint)-iVar26;
          ref_mv.col = (int16_t)-iVar26;
          ref_mv.row = local_3f4.row;
          uVar38 = 0;
        }
        else {
          iVar26 = (cpi->common).width;
          iVar39 = (cpi->common).height;
          if (iVar26 < iVar39) {
            iVar39 = iVar26;
          }
          iVar26 = (pyVar7->field_4).field_0.y_stride;
          iVar41 = (pyVar7->field_0).field_0.y_width;
          iVar34 = (pYVar9->field_0).field_0.y_width;
          iVar49 = iVar26 * (int)local_3c0 + (int)local_3a8;
          puVar36 = pbVar1->buf;
          puVar11 = (td->mb).plane[0].src.buf0;
          iVar14 = (td->mb).plane[0].src.width;
          iVar15 = (td->mb).plane[0].src.height;
          iVar16 = (td->mb).plane[0].src.stride;
          uVar17 = *(undefined4 *)&(td->mb).plane[0].src.field_0x1c;
          puVar12 = pbVar2->buf;
          puVar13 = (td->mb).e_mbd.plane[0].pre[0].buf0;
          iVar18 = (td->mb).e_mbd.plane[0].pre[0].width;
          iVar19 = (td->mb).e_mbd.plane[0].pre[0].height;
          iVar20 = (td->mb).e_mbd.plane[0].pre[0].stride;
          uVar21 = *(undefined4 *)&(td->mb).e_mbd.plane[0].pre[0].field_0x1c;
          iVar43 = (pyVar7->field_2).field_0.y_crop_width;
          size = (pyVar7->field_3).field_0.y_crop_height;
          if (size < iVar43) {
            size = iVar43;
          }
          local_410 = av1_init_search_range(size);
          local_420 = (double)CONCAT71(local_420._1_7_,
                                       (cpi->common).features.cur_frame_force_integer_mv);
          local_368 = CONCAT44(local_368._4_4_,iVar39);
          uVar50 = (uint)(byte)((0x1df < iVar39) + 1);
          if (0x2cf < iVar39) {
            uVar50 = 3;
          }
          local_3b0 = (YV12_BUFFER_CONFIG *)CONCAT44(local_3b0._4_4_,uVar50);
          FVar25 = get_fullmv_from_mv(&ref_mv);
          baseline_mv.row = 0;
          baseline_mv.col = 0;
          local_3b8 = (ulong)(iVar49 * 0x20);
          (td->mb).plane[0].src.buf = (pyVar7->field_5).buffers[0] + local_3b8;
          (td->mb).plane[0].src.stride = iVar26;
          (td->mb).plane[0].src.width = iVar41;
          (td->mb).e_mbd.plane[0].pre[0].buf = (pYVar9->field_5).buffers[0] + local_3b8;
          (td->mb).e_mbd.plane[0].pre[0].stride = iVar26;
          (td->mb).e_mbd.plane[0].pre[0].width = iVar34;
          (td->mb).e_mbd.mi_row = local_308;
          (td->mb).e_mbd.mi_col = local_304;
          search_sites = local_258;
          if (((iVar26 != (cpi->mv_search_params).search_site_cfg[0][0].stride) &&
              (search_sites = local_260,
              iVar26 != (cpi->mv_search_params).search_site_cfg[1][0].stride)) &&
             (search_sites = psVar3, iVar26 != (td->mb).search_site_cfg_buf[1].stride)) {
            (*local_268)(local_270,iVar26,0);
          }
          iVar39 = get_q(cpi);
          av1_make_default_fullpel_ms_params
                    (&full_ms_params,cpi,&td->mb,BLOCK_32X32,&baseline_mv,FVar25,search_sites,'\x01'
                     ,0);
          full_ms_params.run_mesh_search = 1;
          full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3b0;
          if ((cpi->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
            full_ms_params.prune_mesh_search._0_1_ = 0x14 < iVar39;
            full_ms_params.run_mesh_search = 1;
            full_ms_params.prune_mesh_search._1_3_ = 0;
            full_ms_params.mesh_search_mv_diff_threshold = 2;
          }
          piVar31 = cost_list;
          if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
            piVar31 = (int *)0x0;
          }
          else if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
            piVar31 = (int *)0x0;
          }
          best_mv = (FULLPEL_MV *)&local_424;
          local_318 = search_sites;
          av1_full_pixel_search
                    (FVar25,&full_ms_params,local_410,piVar31,best_mv,&local_28c,(FULLPEL_MV *)0x0);
          if ((char)local_420 == '\0') {
            local_398 = (long)iVar26;
            av1_make_default_subpel_ms_params
                      (&ms_params,cpi,&td->mb,BLOCK_32X32,&baseline_mv,cost_list);
            ms_params.forced_stop = '\0';
            ms_params.var_params.subpel_search_type = '\x03';
            ms_params.mv_cost_params.mv_cost_type = '\x04';
            local_28c.err_cost = 0;
            uVar50 = (*(cpi->mv_search_params).find_fractional_mv_step)
                               (local_358,&cpi->common,&ms_params,
                                (MV)(((uint)local_424 >> 0x10) * 0x80000 +
                                    ((uint)local_424 & 0x1fff) * 8),&local_28c,(MV *)best_mv,
                                &distortion,&sse,(int_mv *)0x0);
            MVar45 = local_424;
            ref_mv = local_424;
            uVar38 = CONCAT71((int7)((ulong)best_mv >> 8),uVar50 * 0x32 < sse);
            local_388 = (ulong)((uint)local_424 >> 0x10);
            local_3f4 = local_424;
            if (bVar10) {
              local_348 = CONCAT44(local_348._4_4_,uVar50);
              local_340 = CONCAT44(local_340._4_4_,(int)uVar38);
              bVar29 = block_size_high[local_350];
              local_320 = (ulong)block_size_wide[local_350];
              uVar50 = (uint)block_size_wide[local_350] * (uint)bVar29;
              FVar25 = get_fullmv_from_mv(&ref_mv);
              local_420 = (double)CONCAT44(local_420._4_4_,FVar25);
              local_330 = CONCAT44(local_330._4_4_,(uint)(0x14 < iVar39));
              local_328 = (uint8_t *)CONCAT44(local_328._4_4_,uVar50 >> 1);
              local_398 = local_398 * (ulong)bVar29;
              lVar47 = 0;
              uVar38 = 0;
              local_338 = (ulong)bVar29;
              while (uVar38 < 0x20) {
                lVar47 = (long)(int)lVar47;
                uVar32 = local_3b8;
                local_390 = uVar38;
                for (uVar44 = 0; uVar44 < 0x20; uVar44 = uVar44 + local_320) {
                  (td->mb).plane[0].src.buf = (pyVar7->field_5).buffers[0] + uVar32;
                  (td->mb).e_mbd.plane[0].pre[0].buf = (pYVar9->field_5).buffers[0] + uVar32;
                  av1_make_default_fullpel_ms_params
                            (&full_ms_params,cpi,&td->mb,(BLOCK_SIZE)local_350,&baseline_mv,
                             local_420._0_4_,local_318,'\x01',0);
                  full_ms_params.mv_cost_params.mv_cost_type = (MV_COST_TYPE)local_3b0;
                  if ((cpi->sf).mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_1) {
                    full_ms_params.mesh_search_mv_diff_threshold = 2;
                    full_ms_params.prune_mesh_search = (int)local_330;
                  }
                  full_ms_params.run_mesh_search = 1;
                  if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
                    piVar31 = (int *)0x0;
                  }
                  else {
                    piVar31 = cost_list;
                    if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
                      piVar31 = (int *)0x0;
                    }
                  }
                  av1_full_pixel_search
                            (local_420._0_4_,&full_ms_params,local_410,piVar31,
                             (FULLPEL_MV *)&local_424,&local_28c,(FULLPEL_MV *)0x0);
                  av1_make_default_subpel_ms_params
                            (&ms_params,cpi,&td->mb,(BLOCK_SIZE)local_350,&baseline_mv,cost_list);
                  ms_params.forced_stop = '\0';
                  ms_params.var_params.subpel_search_type = '\x03';
                  ms_params.mv_cost_params.mv_cost_type = '\x04';
                  local_28c.err_cost = 0;
                  iVar26 = (*(cpi->mv_search_params).find_fractional_mv_step)
                                     (local_358,&cpi->common,&ms_params,
                                      (MV)(((uint)local_424 >> 0x10) * 0x80000 +
                                          ((uint)local_424 & 0x1fff) * 8),&local_28c,&local_424,
                                      &distortion,&sse,(int_mv *)0x0);
                  subblock_mses[lVar47] = (uint)(iVar26 + (int)local_328) / uVar50;
                  subblock_mvs[lVar47] = local_424;
                  lVar47 = lVar47 + 1;
                  uVar32 = uVar32 + local_320;
                }
                local_3b8 = local_3b8 + local_398;
                uVar38 = local_390 + local_338;
              }
              uVar38 = local_340 & 0xffffffff;
              uVar50 = (uint)local_348;
            }
          }
          else {
            sVar23 = local_424.row;
            iVar39 = (int)local_424 >> 0x10;
            auVar55 = psllw(ZEXT416((uint)local_424),3);
            local_424 = auVar55._0_4_;
            uVar50 = (*cpi->ppi->fn_ptr[9].vf)
                               ((pYVar9->field_5).buffers[0] +
                                (long)(sVar23 * iVar26 + iVar39) + local_3b8,iVar26,
                                (pyVar7->field_5).buffers[0] + local_3b8,iVar26,&sse);
            uVar38 = 0;
            MVar45 = local_424;
          }
          uVar50 = uVar50 + 0x200 >> 10;
          (td->mb).plane[0].src.width = iVar14;
          (td->mb).plane[0].src.height = iVar15;
          (td->mb).plane[0].src.stride = iVar16;
          *(undefined4 *)&(td->mb).plane[0].src.field_0x1c = uVar17;
          pbVar1->buf = puVar36;
          (td->mb).plane[0].src.buf0 = puVar11;
          (td->mb).e_mbd.plane[0].pre[0].width = iVar18;
          (td->mb).e_mbd.plane[0].pre[0].height = iVar19;
          (td->mb).e_mbd.plane[0].pre[0].stride = iVar20;
          *(undefined4 *)&(td->mb).e_mbd.plane[0].pre[0].field_0x1c = uVar21;
          pbVar2->buf = puVar12;
          (td->mb).e_mbd.plane[0].pre[0].buf0 = puVar13;
          if (bVar10) {
            iVar26 = -0x80000000;
            iVar39 = 0x7fffffff;
            lVar47 = 0;
            for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
              iVar41 = subblock_mses[lVar40];
              lVar47 = lVar47 + iVar41;
              if (iVar41 <= iVar39) {
                iVar39 = iVar41;
              }
              if (iVar26 <= iVar41) {
                iVar26 = iVar41;
              }
            }
            if (((long)(ulong)(uVar50 * 0xf) < lVar47 * 4 && iVar26 - iVar39 < 0x30) ||
               (iVar26 - iVar39 < 0x18 && (long)(ulong)(uVar50 * 0xe) < lVar47 * 4)) {
              for (lVar47 = 0; lVar47 != 4; lVar47 = lVar47 + 1) {
                subblock_mvs[lVar47] = MVar45;
                subblock_mses[lVar47] = uVar50;
              }
            }
          }
          else {
            for (lVar47 = 0; lVar47 != 4; lVar47 = lVar47 + 1) {
              subblock_mvs[lVar47] = MVar45;
              subblock_mses[lVar47] = uVar50;
            }
          }
          if ((int)((uint)(0x2cf < (int)local_368) * 9 + 3 << ((char)(td->mb).e_mbd.bd - 8U & 0x1f))
              < (int)uVar50) {
            ref_mv.row = 0;
            ref_mv.col = 0;
            local_388 = 0;
            local_3f4.row = 0;
            local_3f4.col = 0;
          }
        }
        iVar26 = 1;
        if ((int)local_3a0 < 1) {
          iVar26 = (int)local_3a0;
        }
        if ((uVar38 & 1) == 0) {
          iVar26 = (int)local_3a0;
        }
        if (local_411 != '\0') {
          iVar26 = (int)local_3a0;
        }
        if ((cpi->oxcf).kf_cfg.enable_keyframe_filtering != 1) {
          iVar26 = (int)local_3a0;
        }
        pYVar9 = (cpi->tf_ctx).frames[uVar27];
        if (uVar27 == uVar6) {
          uVar50 = ((td->mb).e_mbd.cur_buf)->flags;
          uVar32 = 0;
          for (uVar38 = 0; uVar38 != local_370; uVar38 = uVar38 + 1) {
            uVar46 = 0x20 >> ((byte)local_360[uVar38].subsampling_y & 0x1f);
            uVar44 = 0x20L >> ((byte)local_360[uVar38].subsampling_x & 0x3f);
            iVar39 = *(int *)((long)pYVar9->store_buf_adr + (ulong)(uVar38 != 0) * 4 + -0x28);
            puVar36 = pYVar9->store_buf_adr[uVar38 - 4];
            local_420 = (double)CONCAT44(local_420._4_4_,uVar46);
            iVar41 = (int)uVar44;
            lVar47 = (long)(int)((int)local_3a8 * iVar41 + (int)local_3c0 * iVar39 * uVar46);
            puVar48 = local_380 + uVar32;
            puVar53 = local_378 + uVar32;
            iVar34 = 0;
            for (uVar37 = 0; uVar37 != uVar46; uVar37 = uVar37 + 1) {
              for (uVar51 = 0; uVar44 != uVar51; uVar51 = uVar51 + 1) {
                if ((uVar50 & 8) == 0) {
                  uVar42 = (uint)puVar36[uVar51 + iVar34 + lVar47];
                }
                else {
                  uVar42 = (uint)*(ushort *)
                                  (lVar47 * 2 + (long)puVar36 * 2 + (long)iVar34 * 2 + uVar51 * 2);
                }
                puVar53[uVar51] = puVar53[uVar51] + uVar42 * 1000;
                puVar48[uVar51] = puVar48[uVar51] + 1000;
              }
              iVar34 = (int)uVar51 + iVar34 + (iVar39 - iVar41);
              puVar48 = (uint16_t *)((long)puVar48 + (ulong)(uint)(iVar41 * 2));
              puVar53 = (uint32_t *)((long)puVar53 + (ulong)(uint)(iVar41 * 4));
            }
            uVar32 = (ulong)((int)uVar32 + uVar46 * iVar41);
          }
        }
        else {
          uVar50 = (td->mb).e_mbd.bd;
          local_330 = (ulong)uVar50;
          local_3b8 = CONCAT44(local_3b8._4_4_,(uint)pYVar9->flags >> 3) & 0xffffffff00000001;
          iVar39 = uVar50 - 7;
          iVar41 = 0x15 - uVar50;
          if ((int)uVar50 < 0xb) {
            iVar39 = 3;
          }
          local_398 = CONCAT44(local_398._4_4_,iVar39);
          if ((int)uVar50 < 0xb) {
            iVar41 = 0xb;
          }
          local_338 = CONCAT44(local_338._4_4_,iVar41);
          uVar50 = 0;
          for (uVar38 = 0; uVar38 != local_370; uVar38 = uVar38 + 1) {
            iVar39 = local_360[uVar38].subsampling_y;
            bVar29 = (byte)iVar39;
            local_368 = 0x20L >> (bVar29 & 0x3f);
            bVar30 = (byte)local_360[uVar38].subsampling_x;
            uVar44 = 0x20L >> (bVar30 & 0x3f);
            local_340 = (ulong)(uint)((int)local_230 >> (bVar29 & 0x1f));
            uVar37 = (uint)local_228;
            local_420 = (double)(0x10L >> (bVar29 & 0x3f));
            uVar51 = 0x10L >> (bVar30 & 0x3f);
            uVar32 = (ulong)(uVar38 != 0);
            local_410 = *(int *)((long)pYVar9->store_buf_adr + uVar32 * 4 + -0x48);
            local_3b0 = (YV12_BUFFER_CONFIG *)
                        CONCAT44(local_3b0._4_4_,
                                 *(undefined4 *)((long)pYVar9->store_buf_adr + uVar32 * 4 + -0x40));
            local_318 = (search_site_config *)
                        CONCAT44(local_318._4_4_,
                                 *(undefined4 *)((long)pYVar9->store_buf_adr + uVar32 * 4 + -0x28));
            local_390 = CONCAT44(local_390._4_4_,local_360[uVar38].subsampling_x);
            local_320 = CONCAT44(local_320._4_4_,(0x120U >> (bVar29 & 0x1f)) * -0x400 + 0x1000);
            local_408 = puVar8 + uVar50;
            local_348 = (long)local_420 * uVar44;
            local_328 = pYVar9->store_buf_adr[uVar38 - 4];
            lVar47 = 0;
            uVar32 = 0;
            local_300 = uVar50;
            while (uVar32 < local_368) {
              lVar47 = (long)(int)lVar47;
              iVar41 = (int)local_340;
              local_3a0 = uVar32;
              for (uVar52 = 0; uVar22 = local_338, uVar52 < uVar44; uVar52 = uVar52 + uVar51) {
                full_ms_params.mesh_search_mv_diff_threshold = (int)uVar51;
                full_ms_params.force_mesh_thresh = SUB84(local_420,0);
                full_ms_params.mesh_patterns[0]._0_4_ = iVar41 + (int)uVar32;
                full_ms_params.mesh_patterns[0]._4_4_ = (uVar37 >> (bVar30 & 0x1f)) + (int)uVar52;
                full_ms_params.mv_cost_params.full_ref_mv = local_390._0_4_;
                full_ms_params.mv_cost_params._12_4_ = iVar39;
                full_ms_params.mv_cost_params.mvcost[0]._0_4_ = (int)local_330;
                full_ms_params.mv_cost_params.mvcost[0]._4_4_ = (undefined4)local_3b8;
                full_ms_params.sdf._4_4_ = 0;
                full_ms_params.bsize = BLOCK_4X4;
                full_ms_params._1_7_ = 0;
                full_ms_params.sdx4df._0_4_ = (undefined4)local_320;
                full_ms_params.sdx4df._4_4_ = (0x120U >> (bVar30 & 0x1f)) * -0x400 + 0x1000;
                full_ms_params.mv_limits.row_min = 0x54fd70;
                full_ms_params.mv_limits.row_max = 0;
                full_ms_params.run_mesh_search = 0x54fd70;
                full_ms_params.prune_mesh_search = 0;
                full_ms_params.mv_cost_params.mvjcost = &local_220->x_scale_fp;
                full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
                full_ms_params._136_8_ = local_328;
                full_ms_params.fast_obmc_search = local_410;
                full_ms_params._148_4_ = local_3b0._0_4_;
                full_ms_params.mv_cost_params.ref_mv._0_4_ = local_318._0_4_;
                full_ms_params.ms_buffers.mask_stride = 0;
                ms_params.allow_hp = *(int *)(subblock_mvs + lVar47);
                full_ms_params.ms_buffers.wsrc = (int32_t *)0x0;
                lVar47 = lVar47 + 1;
                full_ms_params.ms_buffers.obmc_mask._0_4_ = 0;
                full_ms_params.ms_buffers.obmc_mask._4_4_ = (undefined4)local_398;
                full_ms_params.search_method = (SEARCH_METHODS)local_338;
                full_ms_params._73_3_ = local_338._1_3_;
                full_ms_params._76_4_ = SUB84(uVar38,0);
                full_ms_params.search_sites = (search_site_config *)0x0;
                local_338 = uVar22;
                av1_enc_build_one_inter_predictor
                          (local_408 + uVar52,(int)uVar44,(MV *)&ms_params,
                           (InterPredParams *)&full_ms_params);
              }
              local_408 = local_408 + local_348;
              uVar32 = local_3a0 + (long)local_420;
            }
            uVar50 = (int)uVar44 * (int)local_368 + local_300;
          }
          pp_Var28 = &av1_highbd_apply_temporal_filter;
          if ((pyVar7->flags & 8) == 0) {
            pp_Var28 = &av1_apply_temporal_filter;
          }
          (**pp_Var28)(pyVar7,local_358,BLOCK_32X32,(int)local_3c0,(int)local_3a8,(int)local_370,
                       local_250,subblock_mvs,subblock_mses,(int)local_240,iVar26,(int)local_248,
                       puVar8,local_378,local_380);
        }
      }
      uVar27 = uVar27 + 1;
      local_3a0 = CONCAT44(local_3a0._4_4_,iVar26);
    }
    local_3b0 = (cpi->tf_ctx).output_frame;
    uVar50 = local_3b0->flags;
    uVar38 = 0;
    for (uVar27 = 0; uVar27 != local_370; uVar27 = uVar27 + 1) {
      uVar46 = 0x20 >> ((byte)local_360[uVar27].subsampling_y & 0x1f);
      uVar32 = 0x20L >> ((byte)local_360[uVar27].subsampling_x & 0x3f);
      iVar39 = *(int *)((long)local_3b0->store_buf_adr + (ulong)(uVar27 != 0) * 4 + -0x28);
      iVar34 = (int)uVar32;
      iVar41 = iVar34 * (int)local_3a8 + (int)local_3c0 * iVar39 * uVar46;
      puVar36 = local_3b0->store_buf_adr[uVar27 - 4];
      local_410 = (int)uVar38;
      iVar39 = iVar39 - iVar34;
      local_420 = (double)CONCAT44(local_420._4_4_,iVar39);
      puVar53 = local_378 + uVar38;
      local_390 = (ulong)(uint)(iVar34 * 4);
      puVar48 = local_380 + uVar38;
      for (uVar37 = 0; uVar37 != uVar46; uVar37 = uVar37 + 1) {
        for (uVar38 = 0; uVar32 != uVar38; uVar38 = uVar38 + 1) {
          uVar5 = puVar48[uVar38];
          uVar44 = (ulong)uVar5;
          uVar35 = (uint)(uVar5 >> 1);
          uVar42 = (uint)uVar5;
          if ((uVar50 & 8) == 0) {
            if (uVar5 < 0x400) {
              iVar43 = 0x1f;
              if (uVar42 != 0) {
                for (; uVar5 >> iVar43 == 0; iVar43 = iVar43 + -1) {
                }
              }
              uVar33 = (uint8_t)((uint)((ulong)*(uint *)(_compoundliteral_26 + uVar44 * 8 + 0x34) +
                                        (ulong)(uVar35 + puVar53[uVar38]) *
                                        (ulong)*(uint *)(_compoundliteral_26 + uVar44 * 8 + 0x30) >>
                                       0x20) >> ((byte)iVar43 & 0x1f));
            }
            else {
              uVar33 = (uint8_t)((uVar35 + puVar53[uVar38]) / uVar42);
            }
            puVar36[uVar38 + (long)iVar41] = uVar33;
          }
          else {
            if (uVar5 < 0x400) {
              iVar43 = 0x1f;
              if (uVar42 != 0) {
                for (; uVar5 >> iVar43 == 0; iVar43 = iVar43 + -1) {
                }
              }
              uVar24 = (undefined2)
                       ((uint)((ulong)*(uint *)(_compoundliteral_26 + uVar44 * 8 + 0x34) +
                               (ulong)(uVar35 + puVar53[uVar38]) *
                               (ulong)*(uint *)(_compoundliteral_26 + uVar44 * 8 + 0x30) >> 0x20) >>
                       ((byte)iVar43 & 0x1f));
            }
            else {
              uVar24 = (undefined2)((uVar35 + puVar53[uVar38]) / (uint)uVar5);
            }
            *(undefined2 *)((long)puVar36 * 2 + (long)iVar41 * 2 + uVar38 * 2) = uVar24;
          }
        }
        iVar41 = (int)uVar38 + iVar41 + iVar39;
        puVar53 = (uint32_t *)((long)puVar53 + local_390);
        puVar48 = (uint16_t *)((long)puVar48 + (ulong)(uint)(iVar34 * 2));
      }
      uVar38 = (ulong)(local_410 + uVar46 * iVar34);
    }
    if (local_30c != 0) {
      iVar39 = (pyVar7->field_4).field_0.y_stride;
      pYVar9 = (cpi->tf_ctx).output_frame;
      iVar41 = (pYVar9->field_4).field_0.y_stride;
      iVar34 = (0x20U >> ((byte)(td->mb).e_mbd.plane[0].subsampling_y & 0x1f)) * (int)local_3c0;
      iVar43 = (0x20U >> ((byte)(td->mb).e_mbd.plane[0].subsampling_x & 0x1f)) * (int)local_3a8;
      full_ms_params._0_8_ = full_ms_params._0_8_ & 0xffffffff00000000;
      (*cpi->ppi->fn_ptr[9].vf)
                ((pyVar7->field_5).buffers[0] + (iVar34 * iVar39 + iVar43),iVar39,
                 (pYVar9->field_5).buffers[0] + (iVar43 + iVar41 * iVar34),iVar41,
                 (uint *)&full_ms_params);
      uVar27 = full_ms_params._0_8_ & 0xffffffff;
      (td->tf_data).diff.sum = (td->tf_data).diff.sum + uVar27;
      piVar4 = &(td->tf_data).diff.sse;
      *piVar4 = *piVar4 + uVar27 * uVar27;
    }
    uVar27 = (ulong)(iVar26 + 1);
  }
  return;
}

Assistant:

void av1_tf_do_filtering_row(AV1_COMP *cpi, ThreadData *td, int mb_row) {
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  YV12_BUFFER_CONFIG **frames = tf_ctx->frames;
  const int num_frames = tf_ctx->num_frames;
  const int filter_frame_idx = tf_ctx->filter_frame_idx;
  const int compute_frame_diff = tf_ctx->compute_frame_diff;
  const struct scale_factors *scale = &tf_ctx->sf;
  const double *noise_levels = tf_ctx->noise_levels;
  const int num_pels = tf_ctx->num_pels;
  const int q_factor = tf_ctx->q_factor;
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const YV12_BUFFER_CONFIG *const frame_to_filter = frames[filter_frame_idx];
  MACROBLOCK *const mb = &td->mb;
  MACROBLOCKD *const mbd = &mb->e_mbd;
  TemporalFilterData *const tf_data = &td->tf_data;
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mi_h = mi_size_high_log2[block_size];
  const int mi_w = mi_size_wide_log2[block_size];
  const int num_planes = av1_num_planes(&cpi->common);
  const int weight_calc_level_in_tf = cpi->sf.hl_sf.weight_calc_level_in_tf;
  uint32_t *accum = tf_data->accum;
  uint16_t *count = tf_data->count;
  uint8_t *pred = tf_data->pred;

  // Factor to control the filering strength.
  int filter_strength = cpi->oxcf.algo_cfg.arnr_strength;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];

  // Do filtering.
  FRAME_DIFF *diff = &td->tf_data.diff;
  av1_set_mv_row_limits(&cpi->common.mi_params, &mb->mv_limits,
                        (mb_row << mi_h), (mb_height >> MI_SIZE_LOG2),
                        cpi->oxcf.border_in_pixels);
  for (int mb_col = 0; mb_col < tf_ctx->mb_cols; mb_col++) {
    av1_set_mv_col_limits(&cpi->common.mi_params, &mb->mv_limits,
                          (mb_col << mi_w), (mb_width >> MI_SIZE_LOG2),
                          cpi->oxcf.border_in_pixels);
    memset(accum, 0, num_pels * sizeof(accum[0]));
    memset(count, 0, num_pels * sizeof(count[0]));
    MV ref_mv = kZeroMv;  // Reference motion vector passed down along frames.
                          // Perform temporal filtering frame by frame.

    // Decide whether to perform motion search at 16x16 sub-block level or not
    // based on 4x4 sub-blocks source variance. Allow motion search for split
    // partition only if the difference between max and min source variance of
    // 4x4 blocks is greater than a threshold (which is derived empirically).
    bool allow_me_for_sub_blks = true;
    if (cpi->sf.hl_sf.allow_sub_blk_me_in_tf) {
      const int is_hbd = is_frame_high_bitdepth(frame_to_filter);
      // Initialize minimum variance to a large value and maximum variance to 0.
      double blk_4x4_var_min = DBL_MAX;
      double blk_4x4_var_max = 0;
      get_log_var_4x4sub_blk(cpi, frame_to_filter, mb_row, mb_col,
                             TF_BLOCK_SIZE, &blk_4x4_var_min, &blk_4x4_var_max,
                             is_hbd);
      // TODO(sanampudi.venkatarao@ittiam.com): Experiment and adjust the
      // threshold for high bit depth.
      if ((blk_4x4_var_max - blk_4x4_var_min) <= 4.0)
        allow_me_for_sub_blks = false;
    }

    for (int frame = 0; frame < num_frames; frame++) {
      if (frames[frame] == NULL) continue;

      // Motion search.
      MV subblock_mvs[4] = { kZeroMv, kZeroMv, kZeroMv, kZeroMv };
      int subblock_mses[4] = { INT_MAX, INT_MAX, INT_MAX, INT_MAX };
      int is_dc_diff_large = 0;

      if (frame ==
          filter_frame_idx) {  // Frame to be filtered.
                               // Change ref_mv sign for following frames.
        ref_mv.row *= -1;
        ref_mv.col *= -1;
      } else {  // Other reference frames.
        tf_motion_search(cpi, mb, frame_to_filter, frames[frame], block_size,
                         mb_row, mb_col, &ref_mv, allow_me_for_sub_blks,
                         subblock_mvs, subblock_mses, &is_dc_diff_large);
      }

      if (cpi->oxcf.kf_cfg.enable_keyframe_filtering == 1 &&
          frame_type == KEY_FRAME && is_dc_diff_large)
        filter_strength = AOMMIN(filter_strength, 1);

      // Perform weighted averaging.
      if (frame == filter_frame_idx) {  // Frame to be filtered.
        tf_apply_temporal_filter_self(frames[frame], mbd, block_size, mb_row,
                                      mb_col, num_planes, accum, count);
      } else {  // Other reference frames.
        tf_build_predictor(frames[frame], mbd, block_size, mb_row, mb_col,
                           num_planes, scale, subblock_mvs, pred);

        // All variants of av1_apply_temporal_filter() contain floating point
        // operations. Hence, clear the system state.

        // TODO(any): avx2/sse2 version should be changed to align with C
        // function before using. In particular, current avx2/sse2 function
        // only supports 32x32 block size and 5x5 filtering window.
        if (is_frame_high_bitdepth(frame_to_filter)) {  // for high bit-depth
#if CONFIG_AV1_HIGHBITDEPTH
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_highbd_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
#endif  // CONFIG_AV1_HIGHBITDEPTH
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
#if CONFIG_AV1_HIGHBITDEPTH
          }
#endif  // CONFIG_AV1_HIGHBITDEPTH
        } else {
          // for 8-bit
          if (TF_BLOCK_SIZE == BLOCK_32X32 && TF_WINDOW_LENGTH == 5) {
            av1_apply_temporal_filter(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          } else {
            av1_apply_temporal_filter_c(
                frame_to_filter, mbd, block_size, mb_row, mb_col, num_planes,
                noise_levels, subblock_mvs, subblock_mses, q_factor,
                filter_strength, weight_calc_level_in_tf, pred, accum, count);
          }
        }
      }
    }
    tf_normalize_filtered_frame(mbd, block_size, mb_row, mb_col, num_planes,
                                accum, count, tf_ctx->output_frame);

    if (compute_frame_diff) {
      const int y_height = mb_height >> mbd->plane[0].subsampling_y;
      const int y_width = mb_width >> mbd->plane[0].subsampling_x;
      const int source_y_stride = frame_to_filter->y_stride;
      const int filter_y_stride = tf_ctx->output_frame->y_stride;
      const int source_offset =
          mb_row * y_height * source_y_stride + mb_col * y_width;
      const int filter_offset =
          mb_row * y_height * filter_y_stride + mb_col * y_width;
      unsigned int sse = 0;
      cpi->ppi->fn_ptr[block_size].vf(
          frame_to_filter->y_buffer + source_offset, source_y_stride,
          tf_ctx->output_frame->y_buffer + filter_offset, filter_y_stride,
          &sse);
      diff->sum += sse;
      diff->sse += sse * (int64_t)sse;
    }
  }
}